

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

void Acec_MatchBoxesSort(int *pArray,int nSize,int *pCostLits)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (1 < nSize) {
    uVar6 = 1;
    uVar7 = 0;
    do {
      uVar1 = uVar7 + 1;
      uVar9 = uVar7 & 0xffffffff;
      uVar8 = uVar6;
      do {
        uVar2 = pArray[uVar8];
        if ((int)uVar2 < 0) {
LAB_0065a56b:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x135,"int Abc_Lit2LitL(int *, int)");
        }
        if (pCostLits[uVar2 >> 1] < 0) {
LAB_0065a54c:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar3 = pArray[(int)(uint)uVar9];
        if ((int)uVar3 < 0) goto LAB_0065a56b;
        if (pCostLits[uVar3 >> 1] < 0) goto LAB_0065a54c;
        uVar5 = (uint)uVar8;
        if ((pCostLits[uVar2 >> 1] ^ uVar2 & 1) <= (pCostLits[uVar3 >> 1] ^ uVar3 & 1)) {
          uVar5 = (uint)uVar9;
        }
        uVar8 = uVar8 + 1;
        uVar9 = (ulong)uVar5;
      } while ((uint)nSize != uVar8);
      iVar4 = pArray[uVar7];
      pArray[uVar7] = pArray[(int)uVar5];
      pArray[(int)uVar5] = iVar4;
      uVar6 = uVar6 + 1;
      uVar7 = uVar1;
    } while (uVar1 != nSize - 1);
  }
  return;
}

Assistant:

void Acec_MatchBoxesSort( int * pArray, int nSize, int * pCostLits )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Abc_Lit2LitL(pCostLits, pArray[j]) > Abc_Lit2LitL(pCostLits, pArray[best_i]) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}